

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_iraf_open(char *filename,int rwmode,int *hdl)

{
  int iVar1;
  size_t *in_RDX;
  undefined4 in_ESI;
  char **in_RDI;
  size_t filesize;
  int status;
  LONGLONG LVar2;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  LVar2 = 0;
  iVar1 = mem_createmem(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),(int *)0x0);
  if (iVar1 == 0) {
    iVar1 = iraf2mem((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                     (size_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                     (int *)(ulong)in_stack_ffffffffffffffd8);
    if (iVar1 == 0) {
      memTable[(int)*in_RDX].currentpos = 0;
      memTable[(int)*in_RDX].fitsfilesize = LVar2;
      iVar1 = 0;
    }
    else {
      mem_close_free(0);
      ffpmsg((char *)0x1281d8);
    }
  }
  else {
    ffpmsg((char *)0x128161);
  }
  return iVar1;
}

Assistant:

int mem_iraf_open(char *filename, int rwmode, int *hdl)
/*
  This routine creates an empty memory buffer, then calls iraf2mem to
  open the IRAF disk file and convert it to a FITS file in memeory.
*/
{
    int status;
    size_t filesize = 0;

    /* create a memory file with size = 0 for the FITS converted IRAF file */
    status = mem_createmem(filesize, hdl);
    if (status)
    {
        ffpmsg("failed to create empty memory file (mem_iraf_open)");
        return(status);
    }

    /* convert the iraf file into a FITS file in memory */
    status = iraf2mem(filename, memTable[*hdl].memaddrptr,
                      memTable[*hdl].memsizeptr, &filesize, &status);

    if (status)
    {
        mem_close_free(*hdl);   /* free up the memory */
        ffpmsg("failed to convert IRAF file into memory (mem_iraf_open)");
        return(status);
    }

    memTable[*hdl].currentpos = 0;           /* save starting position */
    memTable[*hdl].fitsfilesize=filesize;   /* and initial file size  */

    return(0);
}